

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O0

void __thiscall trng::truncated_normal_dist<float>::param_type::update_Phi(param_type *this)

{
  long in_RDI;
  float fVar1;
  float fVar2;
  
  fVar2 = *(float *)(in_RDI + 8);
  fVar1 = std::numeric_limits<float>::infinity();
  if (fVar2 <= -fVar1) {
    *(undefined4 *)(in_RDI + 0x10) = 0;
  }
  else {
    fVar2 = math::Phi(4.527122e-39);
    *(float *)(in_RDI + 0x10) = fVar2;
  }
  fVar2 = *(float *)(in_RDI + 0xc);
  fVar1 = std::numeric_limits<float>::infinity();
  if (fVar1 <= fVar2) {
    *(undefined4 *)(in_RDI + 0x14) = 0x3f800000;
  }
  else {
    fVar2 = math::Phi(4.527235e-39);
    *(float *)(in_RDI + 0x14) = fVar2;
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
      void update_Phi() {
        if (a_ > -math::numeric_limits<result_type>::infinity())
          Phi_a = math::Phi((a_ - mu_) / sigma_);
        else
          Phi_a = result_type(0);
        if (b_ < math::numeric_limits<result_type>::infinity())
          Phi_b = math::Phi((b_ - mu_) / sigma_);
        else
          Phi_b = result_type(1);
      }